

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void map_int_string(void)

{
  long lVar1;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_212;
  less<int> local_211;
  Assert local_210;
  int local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  s;
  stringstream ss;
  ostream local_198 [24];
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158 [7];
  
  local_1f8._M_dataplus._M_p._0_4_ = 3;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ss,(int *)&local_1f8,(char (*) [7])"Klaatu");
  local_210.m_file = (char *)CONCAT44(local_210.m_file._4_4_,2);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(&local_180,(int *)&local_210,(char (*) [7])"Barada");
  local_1fc = 1;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(local_158,&local_1fc,(char (*) [6])"Nikto");
  __l._M_len = 3;
  __l._M_array = (iterator)&ss;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&s,__l,&local_211,&local_212);
  lVar1 = 0x58;
  do {
    std::__cxx11::string::~string((string *)(&ss + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1f8._M_dataplus._M_p = (pointer)&s;
  UnitTests::stream_any_details::operator<<
            (local_198,
             (outputter<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_1f8);
  local_210.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_210.m_line = 0x8a;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[39],std::__cxx11::string>
            (&local_210,(char (*) [39])"[(1, Nikto), (2, Barada), (3, Klaatu)]",&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&s._M_t);
  return;
}

Assistant:

TEST(map_int_string)
{
    auto s  = std::map<int, std::string>{{3, "Klaatu"}, {2, "Barada"}, {1, "Nikto"}};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[(1, Nikto), (2, Barada), (3, Klaatu)]", ss.str());
}